

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

real fasttext::utils::sigmoid(real x)

{
  real rVar1;
  
  rVar1 = 0.0;
  if (-8.0 <= x) {
    if (8.0 < x) {
      return 1.0;
    }
    rVar1 = *(real *)(t_sigmoid + (long)(int)((x + 8.0) * 512.0 * 0.125 * 0.5) * 4);
  }
  return rVar1;
}

Assistant:

real sigmoid(real x) {
    if (x < -MAX_SIGMOID) {
      return 0.0;
    } else if (x > MAX_SIGMOID) {
      return 1.0;
    } else {
      int i = int((x + MAX_SIGMOID) * SIGMOID_TABLE_SIZE / MAX_SIGMOID / 2);
      return t_sigmoid[i];
    }
  }